

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O1

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
__thiscall
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
scanMul(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
        *__return_storage_ptr__,
       FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
       *this,AbstractingUnifier *au,Numeral *k,TermSpec t)

{
  bool bVar1;
  int local_ec;
  RationalConstantType local_e8;
  TermSpec local_c8;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_b8
  ;
  
  local_c8.index = (int)t.term._content;
  local_c8.term._content = (uint64_t)k;
  IntegerConstantType::IntegerConstantType(&local_e8._num,(IntegerConstantType *)au);
  IntegerConstantType::IntegerConstantType(&local_e8._den,(IntegerConstantType *)&au->_constr);
  local_ec = 0;
  bVar1 = Kernel::operator==(&local_e8,&local_ec);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x90);
    FloorUwaState(__return_storage_ptr__);
  }
  else {
    scan(&local_b8,(AbstractingUnifier *)this,&local_c8);
    mul(__return_storage_ptr__,(AbstractingUnifier *)this,(Numeral *)au,&local_b8);
    ::Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.shieldedVars);
    ::Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.intVarSet);
    ::Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.mixVarSet);
    ::Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.ratVarSet);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.intAtoms);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.ratAtoms);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.mixVars);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.intVars);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b8.ratVars);
  }
  mpz_clear(local_e8._den._val);
  mpz_clear((__mpz_struct *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState scanMul(AbstractingUnifier& au, Numeral const& k, TermSpec t) 
  { return k == 0 ? FloorUwaState::zero() : mul(au, k, scan(au, t)); }